

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Segment::UpdateDocTypeVersion(Segment *this)

{
  Track **ppTVar1;
  Track *pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(this->tracks_).track_entries_size_;
  if ((uVar3 != 0) && (ppTVar1 = (this->tracks_).track_entries_, ppTVar1 != (Track **)0x0)) {
    uVar4 = 0;
    do {
      pTVar2 = ppTVar1[uVar4];
      if (pTVar2 == (Track *)0x0) {
        return;
      }
      if (pTVar2->codec_delay_ == 0) {
        if (pTVar2->seek_pre_roll_ != 0 && this->doc_type_version_ < 4) goto LAB_0014fdf8;
      }
      else if (this->doc_type_version_ < 4) {
LAB_0014fdf8:
        this->doc_type_version_ = 4;
        return;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void Segment::UpdateDocTypeVersion() {
  for (uint32_t index = 0; index < tracks_.track_entries_size(); ++index) {
    const Track* track = tracks_.GetTrackByIndex(index);
    if (track == NULL)
      break;
    if ((track->codec_delay() || track->seek_pre_roll()) &&
        doc_type_version_ < 4) {
      doc_type_version_ = 4;
      break;
    }
  }
}